

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O2

void __thiscall
icu_63::TimeZoneNamesImpl::addAllNamesIntoTrie(TimeZoneNamesImpl *this,UErrorCode *status)

{
  UHashElement *pUVar1;
  int32_t pos;
  int32_t local_2c;
  
  if (U_ZERO_ERROR < *status) {
    return;
  }
  local_2c = -1;
  do {
    pUVar1 = uhash_nextElement_63(this->fMZNamesMap,&local_2c);
    if (pUVar1 == (UHashElement *)0x0) {
      local_2c = -1;
      do {
        pUVar1 = uhash_nextElement_63(this->fTZNamesMap,&local_2c);
        if (pUVar1 == (UHashElement *)0x0) {
          return;
        }
      } while (((ZNames *)(pUVar1->value).pointer == (ZNames *)"<empty>") ||
              (ZNames::addAsTimeZoneIntoTrie
                         ((ZNames *)(pUVar1->value).pointer,(UChar *)(pUVar1->key).pointer,
                          &this->fNamesTrie,status), *status < U_ILLEGAL_ARGUMENT_ERROR));
      return;
    }
  } while (((ZNames *)(pUVar1->value).pointer == (ZNames *)"<empty>") ||
          (ZNames::addAsMetaZoneIntoTrie
                     ((ZNames *)(pUVar1->value).pointer,(UChar *)(pUVar1->key).pointer,
                      &this->fNamesTrie,status), *status < U_ILLEGAL_ARGUMENT_ERROR));
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }